

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# double-to-string.cc
# Opt level: O3

bool __thiscall
double_conversion::DoubleToStringConverter::ToFixed
          (DoubleToStringConverter *this,double value,int requested_digits,
          StringBuilder *result_builder)

{
  int iVar1;
  bool bVar2;
  bool sign;
  int decimal_rep_length;
  int decimal_point;
  char decimal_rep [121];
  bool local_c1;
  int local_c0;
  int local_bc;
  double local_b8;
  char local_a8 [136];
  
  if (0x7fefffffffffffff < (ulong)ABS(value)) {
    bVar2 = HandleSpecialValues(this,value,result_builder);
    return bVar2;
  }
  bVar2 = false;
  if ((requested_digits < 0x3d) && (bVar2 = false, ABS(value) < 1e+60)) {
    local_b8 = value;
    DoubleToAscii(value,FIXED,requested_digits,local_a8,0x79,&local_c1,&local_c0,&local_bc);
    if ((local_c1 == true) && (local_b8 != 0.0 || (this->flags_ & 8U) == 0)) {
      iVar1 = result_builder->position_;
      result_builder->position_ = iVar1 + 1;
      (result_builder->buffer_).start_[iVar1] = '-';
    }
    CreateDecimalRepresentation(this,local_a8,local_c0,local_bc,requested_digits,result_builder);
    bVar2 = true;
  }
  return bVar2;
}

Assistant:

bool DoubleToStringConverter::ToFixed(double value,
                                      int requested_digits,
                                      StringBuilder* result_builder) const {
  DOUBLE_CONVERSION_ASSERT(kMaxFixedDigitsBeforePoint == 60);
  const double kFirstNonFixed = 1e60;

  if (Double(value).IsSpecial()) {
    return HandleSpecialValues(value, result_builder);
  }

  if (requested_digits > kMaxFixedDigitsAfterPoint) return false;
  if (value >= kFirstNonFixed || value <= -kFirstNonFixed) return false;

  // Find a sufficiently precise decimal representation of n.
  int decimal_point;
  bool sign;
  // Add space for the '\0' byte.
  const int kDecimalRepCapacity =
      kMaxFixedDigitsBeforePoint + kMaxFixedDigitsAfterPoint + 1;
  char decimal_rep[kDecimalRepCapacity];
  int decimal_rep_length;
  DoubleToAscii(value, FIXED, requested_digits,
                decimal_rep, kDecimalRepCapacity,
                &sign, &decimal_rep_length, &decimal_point);

  bool unique_zero = ((flags_ & UNIQUE_ZERO) != 0);
  if (sign && (value != 0.0 || !unique_zero)) {
    result_builder->AddCharacter('-');
  }

  CreateDecimalRepresentation(decimal_rep, decimal_rep_length, decimal_point,
                              requested_digits, result_builder);
  return true;
}